

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

char_t * pugi::impl::anon_unknown_0::strconv_escape(char_t *s,gap *g)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  char_t *pcVar4;
  uint ch;
  size_t sStack_20;
  value_type local_18;
  
  local_18 = (value_type)(s + 1);
  cVar2 = s[1];
  if (cVar2 == 'q') {
    if (s[2] != 'u') goto LAB_0017bdfe;
    if (s[3] != 'o') goto LAB_0017be28;
    if (s[4] != 't') goto LAB_0017be50;
    if (s[5] != ';') {
LAB_0017be88:
      return s + 5;
    }
    *s = '\"';
  }
  else {
    if (cVar2 != 'a') {
      if (cVar2 == 'g') {
        if (s[2] != 't') {
LAB_0017bdfe:
          return s + 2;
        }
        if (s[3] != ';') goto LAB_0017be28;
        *s = '>';
      }
      else {
        if (cVar2 != 'l') {
          if (cVar2 != '#') {
            return (char_t *)local_18;
          }
          pcVar4 = s + 2;
          cVar2 = s[2];
          if (cVar2 == ';') {
            return pcVar4;
          }
          if (cVar2 == 'x') {
            pcVar4 = s + 3;
            cVar2 = s[3];
            if (cVar2 == ';') {
              return pcVar4;
            }
            ch = 0;
            do {
              uVar3 = (int)cVar2 - 0x30;
              if (uVar3 < 10) {
                ch = ch << 4 | uVar3;
              }
              else {
                uVar3 = (int)cVar2 | 0x20;
                if (5 < uVar3 - 0x61) goto joined_r0x0017be58;
                ch = (ch * 0x10 + uVar3) - 0x57;
              }
              cVar2 = pcVar4[1];
              pcVar4 = pcVar4 + 1;
            } while( true );
          }
          ch = 0;
          while ((int)cVar2 - 0x30U < 10) {
            ch = ((int)cVar2 - 0x30U) + ch * 10;
            pcVar1 = pcVar4 + 1;
            pcVar4 = pcVar4 + 1;
            cVar2 = *pcVar1;
          }
joined_r0x0017be58:
          if (cVar2 != ';') {
            return pcVar4;
          }
          pcVar4 = pcVar4 + 1;
          if (ch < 0x10000) {
            local_18 = utf8_writer::low((value_type)s,ch);
          }
          else {
            local_18 = utf8_writer::high((value_type)s,ch);
          }
          sStack_20 = (long)pcVar4 - (long)local_18;
          goto LAB_0017be7b;
        }
        if (s[2] != 't') goto LAB_0017bdfe;
        if (s[3] != ';') goto LAB_0017be28;
        *s = '<';
      }
      pcVar4 = s + 4;
      sStack_20 = 3;
      goto LAB_0017be7b;
    }
    if (s[2] != 'p') {
      if (s[2] != 'm') goto LAB_0017bdfe;
      if (s[3] == 'p') {
        if (s[4] == ';') {
          *s = '&';
          pcVar4 = s + 5;
          sStack_20 = 4;
          goto LAB_0017be7b;
        }
LAB_0017be50:
        return s + 4;
      }
LAB_0017be28:
      return s + 3;
    }
    if (s[3] != 'o') goto LAB_0017be28;
    if (s[4] != 's') goto LAB_0017be50;
    if (s[5] != ';') goto LAB_0017be88;
    *s = '\'';
  }
  pcVar4 = s + 6;
  sStack_20 = 5;
LAB_0017be7b:
  gap::push(g,(char_t **)&local_18,sStack_20);
  return pcVar4;
}

Assistant:

PUGI__FN char_t* strconv_escape(char_t* s, gap& g)
	{
		char_t* stre = s + 1;

		switch (*stre)
		{
			case '#':	// &#...
			{
				unsigned int ucsc = 0;

				if (stre[1] == 'x') // &#x... (hex code)
				{
					stre += 2;

					char_t ch = *stre;

					if (ch == ';') return stre;

					for (;;)
					{
						if (static_cast<unsigned int>(ch - '0') <= 9)
							ucsc = 16 * ucsc + (ch - '0');
						else if (static_cast<unsigned int>((ch | ' ') - 'a') <= 5)
							ucsc = 16 * ucsc + ((ch | ' ') - 'a' + 10);
						else if (ch == ';')
							break;
						else // cancel
							return stre;

						ch = *++stre;
					}

					++stre;
				}
				else	// &#... (dec code)
				{
					char_t ch = *++stre;

					if (ch == ';') return stre;

					for (;;)
					{
						if (static_cast<unsigned int>(ch - '0') <= 9)
							ucsc = 10 * ucsc + (ch - '0');
						else if (ch == ';')
							break;
						else // cancel
							return stre;

						ch = *++stre;
					}

					++stre;
				}

			#ifdef PUGIXML_WCHAR_MODE
				s = reinterpret_cast<char_t*>(wchar_writer::any(reinterpret_cast<wchar_writer::value_type>(s), ucsc));
			#else
				s = reinterpret_cast<char_t*>(utf8_writer::any(reinterpret_cast<uint8_t*>(s), ucsc));
			#endif

				g.push(s, stre - s);
				return stre;
			}

			case 'a':	// &a
			{
				++stre;

				if (*stre == 'm') // &am
				{
					if (*++stre == 'p' && *++stre == ';') // &amp;
					{
						*s++ = '&';
						++stre;

						g.push(s, stre - s);
						return stre;
					}
				}
				else if (*stre == 'p') // &ap
				{
					if (*++stre == 'o' && *++stre == 's' && *++stre == ';') // &apos;
					{
						*s++ = '\'';
						++stre;

						g.push(s, stre - s);
						return stre;
					}
				}
				break;
			}

			case 'g': // &g
			{
				if (*++stre == 't' && *++stre == ';') // &gt;
				{
					*s++ = '>';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			case 'l': // &l
			{
				if (*++stre == 't' && *++stre == ';') // &lt;
				{
					*s++ = '<';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			case 'q': // &q
			{
				if (*++stre == 'u' && *++stre == 'o' && *++stre == 't' && *++stre == ';') // &quot;
				{
					*s++ = '"';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			default:
				break;
		}

		return stre;
	}